

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frame.cpp
# Opt level: O3

FrameList_ * __thiscall rw::FrameList_::streamRead(FrameList_ *this,Stream *stream)

{
  byte *pbVar1;
  bool bVar2;
  int32 iVar3;
  Frame **ppFVar4;
  Frame *child;
  long lVar5;
  FrameStreamData buf;
  undefined8 local_68;
  float32 local_60;
  undefined8 local_5c;
  float32 local_54;
  undefined8 local_50;
  float32 local_48;
  undefined8 local_44;
  float32 local_3c;
  int local_38;
  
  this->numFrames = 0;
  this->frames = (Frame **)0x0;
  bVar2 = findChunk(stream,1,(uint32 *)0x0,(uint32 *)0x0);
  if (bVar2) {
    iVar3 = Stream::readI32(stream);
    this->numFrames = iVar3;
    allocLocation =
         "file: /workspace/llm4binary/github/license_all_cmakelists_1510/AGraber[P]librw/src/frame.cpp line: 377"
    ;
    ppFVar4 = (Frame **)(*Engine::memfuncs)((long)iVar3 << 3,0x3000e);
    this->frames = ppFVar4;
    if (ppFVar4 == (Frame **)0x0) {
      streamRead(this);
    }
    else {
      if (this->numFrames < 1) {
        return this;
      }
      lVar5 = 0;
      while( true ) {
        Stream::read32(stream,&local_68,0x38);
        child = Frame::create();
        this->frames[lVar5] = child;
        if (child == (Frame *)0x0) break;
        (child->matrix).right.z = local_60;
        (child->matrix).right.x = (float32)(undefined4)local_68;
        (child->matrix).right.y = (float32)local_68._4_4_;
        (child->matrix).up.z = local_54;
        (child->matrix).up.x = (float32)(undefined4)local_5c;
        (child->matrix).up.y = (float32)local_5c._4_4_;
        (child->matrix).at.z = local_48;
        (child->matrix).at.x = (float32)(undefined4)local_50;
        (child->matrix).at.y = (float32)local_50._4_4_;
        (child->matrix).pos.x = (float32)(undefined4)local_44;
        (child->matrix).pos.y = (float32)local_44._4_4_;
        (child->matrix).pos.z = local_3c;
        Matrix::optimize(&child->matrix,(Tolerance *)0x0);
        pbVar1 = (byte *)((long)&(child->matrix).flags + 2);
        *pbVar1 = *pbVar1 & 0xfd;
        if (-1 < (long)local_38) {
          Frame::addChild(this->frames[local_38],child,streamAppendFrames);
        }
        lVar5 = lVar5 + 1;
        if (this->numFrames <= lVar5) {
          if (this->numFrames < 1) {
            return this;
          }
          lVar5 = 0;
          do {
            PluginList::streamRead((PluginList *)&Frame::s_plglist,stream,this->frames[lVar5]);
            lVar5 = lVar5 + 1;
          } while (lVar5 < this->numFrames);
          return this;
        }
      }
      (*DAT_00149de0)(this->frames);
    }
  }
  else {
    streamRead();
  }
  return (FrameList_ *)0x0;
}

Assistant:

FrameList_*
FrameList_::streamRead(Stream *stream)
{
	FrameStreamData buf;
	this->numFrames = 0;
	this->frames = nil;
	if(!findChunk(stream, ID_STRUCT, nil, nil)){
		RWERROR((ERR_CHUNK, "STRUCT"));
		return nil;
	}
	this->numFrames = stream->readI32();
	this->frames = (Frame**)rwMalloc(this->numFrames*sizeof(Frame*), MEMDUR_EVENT | ID_FRAMELIST);
	if(this->frames == nil){
		RWERROR((ERR_ALLOC, this->numFrames*sizeof(Frame*)));
		return nil;
	}
	for(int32 i = 0; i < this->numFrames; i++){
		Frame *f;
		stream->read32(&buf, sizeof(buf));
		this->frames[i] = f = Frame::create();
		if(f == nil){
			// TODO: clean up frames?
			rwFree(this->frames);
			return nil;
		}
		f->matrix.right = buf.right;
		f->matrix.up = buf.up;
		f->matrix.at = buf.at;
		f->matrix.pos = buf.pos;
		f->matrix.optimize();
		// RW always removes identity flag
		f->matrix.flags &= ~Matrix::IDENTITY;
		if(buf.parent >= 0)
			this->frames[buf.parent]->addChild(f, rw::streamAppendFrames);
	}
	for(int32 i = 0; i < this->numFrames; i++)
		Frame::s_plglist.streamRead(stream, this->frames[i]);
	return this;
}